

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

void __thiscall
QHttp2ProtocolHandler::handleDataReceived
          (QHttp2ProtocolHandler *this,QByteArray *data,bool endStream)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QByteDataBuffer *this_00;
  QHttpNetworkRequestPrivate *pQVar4;
  QHttpNetworkReplyPrivate *this_01;
  qsizetype qVar5;
  byte in_DL;
  QByteArray *in_RSI;
  QHttp2ProtocolHandler *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkReplyPrivate *replyPrivate;
  QHttpNetworkReply *httpReply;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *httpPair;
  QHttp2Stream *stream;
  QSharedDataPointer<QHttpNetworkRequestPrivate> *in_stack_ffffffffffffffa0;
  QHttp2Stream **in_stack_ffffffffffffffa8;
  QByteArray *bd;
  undefined7 in_stack_ffffffffffffffb8;
  ConnectionType CVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  QObject::sender();
  qobject_cast<QHttp2Stream*>((QObject *)0x2d36ce);
  this_00 = (QByteDataBuffer *)
            QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::operator[]
                      ((QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>
                        *)0xaaaaaaaaaaaaaaaa,in_stack_ffffffffffffffa8);
  bd = (QByteArray *)(this_00->buffers).d.size;
  bVar3 = QByteArray::isEmpty((QByteArray *)0x2d3711);
  if ((!bVar3) &&
     (pQVar4 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(in_stack_ffffffffffffffa0)
     , (pQVar4->needResendWithCredentials & 1U) == 0)) {
    this_01 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2d373e);
    qVar5 = QByteArray::size(in_RSI);
    this_01->totalProgress = qVar5 + this_01->totalProgress;
    QByteDataBuffer::append(this_00,bd);
    CVar6 = (ConnectionType)((ulong)bd >> 0x20);
    bVar3 = QHttpNetworkReplyPrivate::shouldEmitSignals(this_01);
    if (bVar3) {
      QMetaObject::invokeMethod<void(QHttpNetworkReply::*)()>
                ((ContextType *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),
                 (offset_in_QHttpNetworkReply_to_subr *)this_00,CVar6);
      QMetaObject::
      invokeMethod<void(QHttpNetworkReply::*)(long_long,long_long),long_long&,long_long&>
                ((ContextType *)0x0,
                 (offset_in_QHttpNetworkReply_to_subr *)QHttpNetworkReply::dataReadProgress,
                 (ConnectionType)((ulong)in_RDI >> 0x20),(longlong *)in_RSI,
                 (longlong *)CONCAT17(bVar2,in_stack_ffffffffffffffb8));
    }
  }
  CVar6 = (ConnectionType)((ulong)in_RSI >> 0x20);
  QHttp2Stream::clearDownloadBuffer((QHttp2Stream *)0x2d37ff);
  if ((bVar2 & 1) != 0) {
    finishStream(in_RDI,(QHttp2Stream *)replyPrivate,CVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2ProtocolHandler::handleDataReceived(const QByteArray &data, bool endStream)
{
    QHttp2Stream *stream = qobject_cast<QHttp2Stream *>(sender());
    auto &httpPair = requestReplyPairs[stream];
    auto *httpReply = httpPair.second;
    Q_ASSERT(!stream->isPromisedStream());

    if (!data.isEmpty() && !httpPair.first.d->needResendWithCredentials) {
        auto *replyPrivate = httpReply->d_func();

        replyPrivate->totalProgress += data.size();

        replyPrivate->responseData.append(data);

        if (replyPrivate->shouldEmitSignals()) {
            QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::readyRead,
                                      Qt::QueuedConnection);
            QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::dataReadProgress,
                                      Qt::QueuedConnection, replyPrivate->totalProgress,
                                      replyPrivate->bodyLength);
        }
    }
    stream->clearDownloadBuffer();
    if (endStream)
        finishStream(stream, Qt::QueuedConnection);
}